

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  uint64_t this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Iterator *pIVar4;
  uint64_t block_offset;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  code *in_R9;
  byte local_e1;
  Status local_c8;
  Status local_c0;
  undefined8 local_b8 [2];
  undefined8 local_a8 [2];
  Slice local_98;
  Iterator *local_88;
  Iterator *block_iter;
  undefined1 local_78 [16];
  BlockHandle handle;
  FilterBlockReader *filter;
  Slice handle_value;
  Iterator *iiter;
  _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result_local;
  void *arg_local;
  Slice *k_local;
  ReadOptions *options_local;
  Table *this_local;
  Status *s;
  
  Status::Status((Status *)this);
  pIVar4 = Block::NewIterator(*(Block **)(*(long *)options + 0x98),
                              (Comparator *)**(undefined8 **)options);
  (*pIVar4->_vptr_Iterator[5])(pIVar4,arg);
  uVar2 = (*pIVar4->_vptr_Iterator[2])();
  if ((uVar2 & 1) != 0) {
    (*pIVar4->_vptr_Iterator[9])();
    handle.size_ = *(uint64_t *)(*(long *)options + 0x78);
    BlockHandle::BlockHandle((BlockHandle *)(local_78 + 8));
    block_iter._7_1_ = 0;
    local_e1 = 0;
    if (handle.size_ != 0) {
      BlockHandle::DecodeFrom((BlockHandle *)local_78,(Slice *)(local_78 + 8));
      block_iter._7_1_ = 1;
      bVar1 = Status::ok((Status *)local_78);
      this_00 = handle.size_;
      local_e1 = 0;
      if (bVar1) {
        block_offset = BlockHandle::offset((BlockHandle *)(local_78 + 8));
        bVar1 = FilterBlockReader::KeyMayMatch
                          ((FilterBlockReader *)this_00,block_offset,(Slice *)arg);
        local_e1 = bVar1 ^ 0xff;
      }
    }
    if ((block_iter._7_1_ & 1) != 0) {
      Status::~Status((Status *)local_78);
    }
    if ((local_e1 & 1) == 0) {
      iVar3 = (*pIVar4->_vptr_Iterator[9])();
      local_98.data_ = (char *)CONCAT44(extraout_var,iVar3);
      local_88 = BlockReader(options,(ReadOptions *)k,&local_98);
      (*local_88->_vptr_Iterator[5])(local_88,arg);
      uVar2 = (*local_88->_vptr_Iterator[2])();
      if ((uVar2 & 1) != 0) {
        iVar3 = (*local_88->_vptr_Iterator[8])();
        local_a8[0] = CONCAT44(extraout_var_00,iVar3);
        iVar3 = (*local_88->_vptr_Iterator[9])();
        local_b8[0] = CONCAT44(extraout_var_01,iVar3);
        (*in_R9)(handle_result,local_a8,local_b8);
      }
      (*local_88->_vptr_Iterator[10])(&local_c0);
      Status::operator=((Status *)this,&local_c0);
      Status::~Status(&local_c0);
      if (local_88 != (Iterator *)0x0) {
        (*local_88->_vptr_Iterator[1])();
      }
    }
  }
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    (*pIVar4->_vptr_Iterator[10])(&local_c8);
    Status::operator=((Status *)this,&local_c8);
    Status::~Status(&local_c8);
  }
  if (pIVar4 != (Iterator *)0x0) {
    (*pIVar4->_vptr_Iterator[1])();
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}